

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall cmComputeTargetDepends::CollectSideEffects(cmComputeTargetDepends *this)

{
  long lVar1;
  size_t depender_index;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> visited;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  _Stack_58;
  
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,0);
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,
           ((long)(this->InitialGraph).
                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->InitialGraph).
                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_58._M_impl.super__Rb_tree_header._M_header;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar1 = (long)(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if (lVar1 != 0) {
    lVar1 = (lVar1 >> 3) * -0x5555555555555555;
    depender_index = 0;
    do {
      CollectSideEffectsForTarget
                (this,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&_Stack_58,depender_index);
      depender_index = depender_index + 1;
    } while (lVar1 + (ulong)(lVar1 == 0) != depender_index);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&_Stack_58);
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffects()
{
  this->SideEffects.resize(0);
  this->SideEffects.resize(this->InitialGraph.size());

  size_t n = this->InitialGraph.size();
  std::set<size_t> visited;
  for (size_t i = 0; i < n; ++i) {
    this->CollectSideEffectsForTarget(visited, i);
  }
}